

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alListeneriv(ALenum param,ALint *values)

{
  uint local_20;
  uint32 local_1c;
  uint32 i;
  uint32 numvals;
  ALint *values_local;
  ALenum param_local;
  
  local_1c = 1;
  APILOCK();
  IO_ENTRYINFO(ALEE_alListeneriv);
  IO_ENUM(param);
  IO_PTR(values);
  if (param == 0x1004) {
    local_1c = 3;
  }
  else if (param == 0x1006) {
    local_1c = 3;
  }
  else if (param == 0x100f) {
    local_1c = 6;
  }
  if (values == (ALint *)0x0) {
    local_1c = 0;
  }
  IO_UINT32(local_1c);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    IO_INT32(values[local_20]);
  }
  (*REAL_alListeneriv)(param,values);
  check_listener_state();
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alListeneriv(ALenum param, const ALint *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alListeneriv);
    IO_ENUM(param);
    IO_PTR(values);
    switch (param) {
        case AL_POSITION: numvals = 3; break;
        case AL_VELOCITY: numvals = 3; break;
        case AL_ORIENTATION: numvals = 6; break;
        default: break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }
    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }

    REAL_alListeneriv(param, values);

    check_listener_state();

    IO_END();
}